

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u64 sqlite3LogEstToInt(LogEst x)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  short in_register_0000003a;
  int iVar5;
  
  iVar5 = CONCAT22(in_register_0000003a,x);
  if (0x261 < iVar5) {
    return 0x7fffffffffffffff;
  }
  iVar4 = (iVar5 / 10 + ((int)in_register_0000003a >> 0x1f)) - ((int)in_register_0000003a >> 0x1f);
  uVar1 = iVar5 + iVar4 * -10;
  lVar2 = 0;
  if (uVar1 != 0) {
    lVar2 = (long)(int)uVar1 + -1;
  }
  if (4 < uVar1) {
    lVar2 = (long)(int)uVar1 + -2;
  }
  cVar3 = (char)iVar4;
  if (0x1d < x) {
    return lVar2 + 8U << (cVar3 - 3U & 0x3f);
  }
  return lVar2 + 8U >> (3U - cVar3 & 0x3f);
}

Assistant:

SQLITE_PRIVATE u64 sqlite3LogEstToInt(LogEst x){
  u64 n;
  n = x%10;
  x /= 10;
  if( n>=5 ) n -= 2;
  else if( n>=1 ) n -= 1;
  if( x>60 ) return (u64)LARGEST_INT64;
  return x>=3 ? (n+8)<<(x-3) : (n+8)>>(3-x);
}